

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TransformFeedbackTests::init
          (TransformFeedbackTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dVar2;
  DataType DVar3;
  Precision PVar4;
  Interpolation interpolation;
  TestContext *pTVar5;
  Context *context;
  DataType DVar6;
  uint uVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  TestNode *pTVar11;
  TestNode *pTVar12;
  long lVar13;
  TestNode *pTVar14;
  char *pcVar15;
  TestNode *node;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong uVar16;
  long lVar17;
  uint a;
  long lVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  allocator<char> local_d9;
  TestNode *local_d8;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"position",
             "gl_Position capture using transform feedback");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    pcVar15 = init::primitiveTypes[lVar13].name;
    for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 0x10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,pcVar15,(allocator<char> *)&local_70);
      std::operator+(&local_90,&local_b0,"_");
      std::operator+(&name,&local_90,*(char **)((long)&init::bufferModes[0].name + lVar17));
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      pTVar12 = (TestNode *)operator_new(0x148);
      TransformFeedback::PositionCase::PositionCase
                ((PositionCase *)pTVar12,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p
                 ,glcts::fixed_sample_locations_values + 1,
                 *(deUint32 *)((long)&init::bufferModes[0].mode + lVar17),
                 init::primitiveTypes[lVar13].type);
      tcu::TestNode::addChild(pTVar11,pTVar12);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"point_size",
             "gl_PointSize capture using transform feedback");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    pcVar15 = init::primitiveTypes[lVar13].name;
    for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 0x10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,pcVar15,(allocator<char> *)&local_70);
      std::operator+(&local_90,&local_b0,"_");
      std::operator+(&name,&local_90,*(char **)((long)&init::bufferModes[0].name + lVar17));
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      pTVar12 = (TestNode *)operator_new(0x148);
      TransformFeedback::PointSizeCase::PointSizeCase
                ((PointSizeCase *)pTVar12,(this->super_TestCaseGroup).m_context,
                 name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                 *(deUint32 *)((long)&init::bufferModes[0].mode + lVar17),
                 init::primitiveTypes[lVar13].type);
      tcu::TestNode::addChild(pTVar11,pTVar12);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic_types",
             "Basic types in transform feedback");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  pTVar12 = (TestNode *)0x0;
  while( true ) {
    pTVar14 = (TestNode *)operator_new(0x70);
    pTVar5 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (pTVar12 == (TestNode *)0x2) break;
    local_d8 = pTVar12;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar14,pTVar5,init::bufferModes[(long)pTVar12].name,
               glcts::fixed_sample_locations_values + 1);
    dVar1 = init::bufferModes[(long)pTVar12].mode;
    tcu::TestNode::addChild(pTVar11,pTVar14);
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pTVar12 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar12,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::primitiveTypes[lVar13].name,glcts::fixed_sample_locations_values + 1);
      dVar2 = init::primitiveTypes[lVar13].type;
      tcu::TestNode::addChild(pTVar14,pTVar12);
      for (lVar17 = 0; lVar17 != 0x15; lVar17 = lVar17 + 1) {
        DVar3 = init::basicTypes[lVar17];
        DVar6 = glu::getDataTypeScalarType(DVar3);
        for (lVar18 = 0; lVar18 != 0xc; lVar18 = lVar18 + 4) {
          PVar4 = *(Precision *)((long)init::precisions + lVar18);
          pcVar15 = glu::getPrecisionName(PVar4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,pcVar15,(allocator<char> *)&local_70);
          std::operator+(&local_90,&local_b0,"_");
          pcVar15 = glu::getDataTypeName(DVar3);
          std::operator+(&name,&local_90,pcVar15);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          node = (TestNode *)operator_new(0x148);
          TransformFeedback::BasicTypeCase::BasicTypeCase
                    ((BasicTypeCase *)node,(this->super_TestCaseGroup).m_context,
                     name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,dVar1,dVar2,
                     DVar3,PVar4,(uint)(DVar6 != TYPE_FLOAT));
          tcu::TestNode::addChild(pTVar12,node);
          std::__cxx11::string::~string((string *)&name);
        }
      }
    }
    pTVar12 = (TestNode *)((long)&local_d8->_vptr_TestNode + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar14,pTVar5,"array","Capturing whole array in TF");
  tcu::TestNode::addChild((TestNode *)this,pTVar14);
  lVar13 = 0;
  while( true ) {
    pTVar11 = (TestNode *)operator_new(0x70);
    pTVar5 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    local_d8 = pTVar11;
    if (lVar13 == 2) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar11,pTVar5,init::bufferModes[lVar13].name,
               glcts::fixed_sample_locations_values + 1);
    dVar1 = init::bufferModes[lVar13].mode;
    tcu::TestNode::addChild(pTVar14,pTVar11);
    for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
      pTVar11 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::primitiveTypes[lVar17].name,glcts::fixed_sample_locations_values + 1);
      dVar2 = init::primitiveTypes[lVar17].type;
      tcu::TestNode::addChild(local_d8,pTVar11);
      for (lVar18 = 0; lVar18 != 0x15; lVar18 = lVar18 + 1) {
        DVar3 = init::basicTypes[lVar18];
        DVar6 = glu::getDataTypeScalarType(DVar3);
        for (lVar20 = 0; lVar20 != 0xc; lVar20 = lVar20 + 4) {
          PVar4 = *(Precision *)((long)init::precisions + lVar20);
          pcVar15 = glu::getPrecisionName(PVar4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,pcVar15,(allocator<char> *)&local_70);
          std::operator+(&local_90,&local_b0,"_");
          pcVar15 = glu::getDataTypeName(DVar3);
          std::operator+(&name,&local_90,pcVar15);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          pTVar12 = (TestNode *)operator_new(0x148);
          TransformFeedback::BasicArrayCase::BasicArrayCase
                    ((BasicArrayCase *)pTVar12,(this->super_TestCaseGroup).m_context,
                     name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,dVar1,dVar2,
                     DVar3,PVar4,(uint)(DVar6 != TYPE_FLOAT));
          tcu::TestNode::addChild(pTVar11,pTVar12);
          std::__cxx11::string::~string((string *)&name);
        }
      }
    }
    lVar13 = lVar13 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar5,"array_element","Capturing single array element in TF")
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  lVar13 = 0;
  while( true ) {
    pTVar11 = (TestNode *)operator_new(0x70);
    pTVar5 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar13 == 2) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar11,pTVar5,init::bufferModes[lVar13].name,
               glcts::fixed_sample_locations_values + 1);
    dVar1 = init::bufferModes[lVar13].mode;
    tcu::TestNode::addChild(local_d8,pTVar11);
    for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
      pTVar12 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar12,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::primitiveTypes[lVar17].name,glcts::fixed_sample_locations_values + 1);
      dVar2 = init::primitiveTypes[lVar17].type;
      tcu::TestNode::addChild(pTVar11,pTVar12);
      for (lVar18 = 0; lVar18 != 0x15; lVar18 = lVar18 + 1) {
        DVar3 = init::basicTypes[lVar18];
        DVar6 = glu::getDataTypeScalarType(DVar3);
        for (lVar20 = 0; lVar20 != 0xc; lVar20 = lVar20 + 4) {
          PVar4 = *(Precision *)((long)init::precisions + lVar20);
          pcVar15 = glu::getPrecisionName(PVar4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,pcVar15,(allocator<char> *)&local_70);
          std::operator+(&local_90,&local_b0,"_");
          pcVar15 = glu::getDataTypeName(DVar3);
          std::operator+(&name,&local_90,pcVar15);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          pTVar14 = (TestNode *)operator_new(0x148);
          TransformFeedback::ArrayElementCase::ArrayElementCase
                    ((ArrayElementCase *)pTVar14,(this->super_TestCaseGroup).m_context,
                     name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,dVar1,dVar2,
                     DVar3,PVar4,(uint)(DVar6 != TYPE_FLOAT));
          tcu::TestNode::addChild(pTVar12,pTVar14);
          std::__cxx11::string::~string((string *)&name);
        }
      }
    }
    lVar13 = lVar13 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar5,"interpolation",
             "Different interpolation modes in transform feedback varyings");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    interpolation = init::interpModes[lVar13].interp;
    pTVar12 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar12,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::interpModes[lVar13].name,glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar11,pTVar12);
    for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
      PVar4 = init::precisions[lVar17];
      for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
        for (lVar20 = 0; lVar20 != 0x20; lVar20 = lVar20 + 0x10) {
          pcVar15 = glu::getPrecisionName(PVar4);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar15,&local_d9);
          std::operator+(&local_70,&local_50,"_vec4_");
          std::operator+(&local_b0,&local_70,init::primitiveTypes[lVar18].name);
          std::operator+(&local_90,&local_b0,"_");
          std::operator+(&name,&local_90,*(char **)((long)&init::bufferModes[0].name + lVar20));
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          pTVar14 = (TestNode *)operator_new(0x148);
          TransformFeedback::BasicTypeCase::BasicTypeCase
                    ((BasicTypeCase *)pTVar14,(this->super_TestCaseGroup).m_context,
                     name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                     *(deUint32 *)((long)&init::bufferModes[0].mode + lVar20),
                     init::primitiveTypes[lVar18].type,TYPE_FLOAT_VEC4,PVar4,interpolation);
          tcu::TestNode::addChild(pTVar12,pTVar14);
          std::__cxx11::string::~string((string *)&name);
        }
      }
    }
  }
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Randomized transform feedback cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  uVar16 = extraout_RAX;
  local_d8 = pTVar11;
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    pTVar12 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar12,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[lVar13].name,glcts::fixed_sample_locations_values + 1);
    dVar1 = init::bufferModes[lVar13].mode;
    tcu::TestNode::addChild(pTVar11,pTVar12);
    uVar16 = extraout_RAX_00;
    for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
      pTVar11 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::primitiveTypes[lVar17].name,glcts::fixed_sample_locations_values + 1);
      dVar2 = init::primitiveTypes[lVar17].type;
      tcu::TestNode::addChild(pTVar12,pTVar11);
      iVar19 = 10;
      uVar16 = extraout_RAX_01;
      a = 0;
      while( true ) {
        bVar21 = iVar19 == 0;
        iVar19 = iVar19 + -1;
        if (bVar21) break;
        pTVar14 = (TestNode *)operator_new(0x148);
        context = (this->super_TestCaseGroup).m_context;
        uVar7 = a + 1;
        local_90._M_dataplus._M_p._0_4_ = uVar7;
        de::toString<int>(&name,(int *)&local_90);
        dVar8 = ::deInt32Hash(a);
        dVar9 = ::deInt32Hash(dVar2);
        dVar10 = ::deInt32Hash(dVar1);
        TransformFeedback::RandomCase::RandomCase
                  ((RandomCase *)pTVar14,context,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,dVar1,dVar2,dVar9 ^ dVar8 ^ dVar10);
        tcu::TestNode::addChild(pTVar11,pTVar14);
        std::__cxx11::string::~string((string *)&name);
        uVar16 = (ulong)uVar7;
        a = uVar7;
      }
      pTVar11 = local_d8;
    }
  }
  return (int)uVar16;
}

Assistant:

void TransformFeedbackTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} bufferModes[] =
	{
		{ "separate",		GL_SEPARATE_ATTRIBS		},
		{ "interleaved",	GL_INTERLEAVED_ATTRIBS	}
	};

	static const struct
	{
		const char*		name;
		deUint32		type;
	} primitiveTypes[] =
	{
		{ "points",			GL_POINTS			},
		{ "lines",			GL_LINES			},
		{ "triangles",		GL_TRIANGLES		}

		// Not supported by GLES3.
//		{ "line_strip",		GL_LINE_STRIP		},
//		{ "line_loop",		GL_LINE_LOOP		},
//		{ "triangle_fan",	GL_TRIANGLE_FAN		},
//		{ "triangle_strip",	GL_TRIANGLE_STRIP	}
	};

	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4
	};

	static const glu::Precision precisions[] =
	{
		glu::PRECISION_LOWP,
		glu::PRECISION_MEDIUMP,
		glu::PRECISION_HIGHP
	};

	static const struct
	{
		const char*		name;
		Interpolation	interp;
	} interpModes[] =
	{
		{ "smooth",		INTERPOLATION_SMOOTH	},
		{ "flat",		INTERPOLATION_FLAT		},
		{ "centroid",	INTERPOLATION_CENTROID	}
	};

	// .position
	{
		tcu::TestCaseGroup* positionGroup = new tcu::TestCaseGroup(m_testCtx, "position", "gl_Position capture using transform feedback");
		addChild(positionGroup);

		for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
		{
			for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
			{
				string name = string(primitiveTypes[primitiveType].name) + "_" + bufferModes[bufferMode].name;
				positionGroup->addChild(new PositionCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type));
			}
		}
	}

	// .point_size
	{
		tcu::TestCaseGroup* pointSizeGroup = new tcu::TestCaseGroup(m_testCtx, "point_size", "gl_PointSize capture using transform feedback");
		addChild(pointSizeGroup);

		for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
		{
			for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
			{
				string name = string(primitiveTypes[primitiveType].name) + "_" + bufferModes[bufferMode].name;
				pointSizeGroup->addChild(new PointSizeCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type));
			}
		}
	}

	// .basic_type
	{
		tcu::TestCaseGroup* basicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "basic_types", "Basic types in transform feedback");
		addChild(basicTypeGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			basicTypeGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new BasicTypeCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .array
	{
		tcu::TestCaseGroup* arrayGroup = new tcu::TestCaseGroup(m_testCtx, "array", "Capturing whole array in TF");
		addChild(arrayGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			arrayGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new BasicArrayCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .array_element
	{
		tcu::TestCaseGroup* arrayElemGroup = new tcu::TestCaseGroup(m_testCtx, "array_element", "Capturing single array element in TF");
		addChild(arrayElemGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			arrayElemGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new ArrayElementCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* interpolationGroup = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Different interpolation modes in transform feedback varyings");
		addChild(interpolationGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(interpModes); modeNdx++)
		{
			Interpolation		interp		= interpModes[modeNdx].interp;
			tcu::TestCaseGroup*	modeGroup	= new tcu::TestCaseGroup(m_testCtx, interpModes[modeNdx].name, "");

			interpolationGroup->addChild(modeGroup);

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision precision = precisions[precNdx];

				for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
				{
					for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
					{
						string name = string(glu::getPrecisionName(precision)) + "_vec4_" + primitiveTypes[primitiveType].name + "_" + bufferModes[bufferMode].name;
						modeGroup->addChild(new BasicTypeCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type, glu::TYPE_FLOAT_VEC4, precision, interp));
					}
				}
			}
		}
	}

	// .random
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized transform feedback cases");
		addChild(randomGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			randomGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int ndx = 0; ndx < 10; ndx++)
				{
					deUint32 seed = deInt32Hash(bufferMode) ^ deInt32Hash(primitiveType) ^ deInt32Hash(ndx);
					primitiveGroup->addChild(new RandomCase(m_context, de::toString(ndx+1).c_str(), "", bufferMode, primitiveType, seed));
				}
			}
		}
	}
}